

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected.hpp
# Opt level: O3

void __thiscall
nonstd::expected_lite::bad_expected_access<int>::~bad_expected_access
          (bad_expected_access<int> *this)

{
  std::exception::~exception((exception *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

class nsel_NODISCARD bad_expected_access : public bad_expected_access< void >
{
public:
    using error_type = E;

    explicit bad_expected_access( error_type error )
    : m_error( error )
    {}

    virtual char const * what() const noexcept override
    {
        return "bad_expected_access";
    }

    nsel_constexpr14 error_type & error() &
    {
        return m_error;
    }

    constexpr error_type const & error() const &
    {
        return m_error;
    }

#if !nsel_COMPILER_GNUC_VERSION || nsel_COMPILER_GNUC_VERSION >= 490

    nsel_constexpr14 error_type && error() &&
    {
        return std::move( m_error );
    }

    constexpr error_type const && error() const &&
    {
        return std::move( m_error );
    }

#endif

private:
    error_type m_error;
}